

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char16_t,char32_t>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs)

{
  wchar32 wVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  wchar32 *pwVar5;
  size_t sVar6;
  char16_t *pcVar7;
  wchar32 wVar8;
  size_t sVar9;
  long lVar10;
  
  pcVar7 = lhs._M_str;
  sVar6 = lhs._M_len;
  pwVar5 = rhs._M_str;
  sVar9 = rhs._M_len;
  do {
    if ((sVar6 == 0) || (sVar9 == 0)) {
      return sVar6 == 0 && sVar9 == 0;
    }
    wVar8 = (wchar32)(ushort)*pcVar7;
    lVar10 = 1;
    if (((sVar6 != 1) && ((wVar8 & 0xfc00U) == 0xd800)) && (((ushort)pcVar7[1] & 0xfc00) == 0xdc00))
    {
      wVar8 = (uint)(ushort)*pcVar7 * 0x400 + (uint)(ushort)pcVar7[1] + L'\xfca02400';
      lVar10 = 2;
    }
    wVar1 = *pwVar5;
    if (wVar8 == wVar1) {
LAB_002370ef:
      pcVar7 = pcVar7 + lVar10;
      sVar6 = sVar6 - lVar10;
      pwVar5 = pwVar5 + 1;
      sVar9 = sVar9 - 1;
      bVar2 = true;
    }
    else {
      iVar3 = jessilib::fold(wVar8);
      iVar4 = jessilib::fold(wVar1);
      if (iVar3 == iVar4) goto LAB_002370ef;
      bVar2 = false;
    }
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}